

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_yell(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  CHAR_DATA *pCVar6;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var7;
  CHAR_DATA *in_stack_00000010;
  DESCRIPTOR_DATA *d;
  char buf [4608];
  bool deaf;
  int in_stack_000012d0;
  int in_stack_000012d4;
  void *in_stack_000012d8;
  void *in_stack_000012e0;
  CHAR_DATA *in_stack_000012e8;
  char *in_stack_000012f0;
  CHAR_DATA *in_stack_ffffffffffffed98;
  char *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  char *in_stack_ffffffffffffedb0;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  char *in_stack_ffffffffffffedc8;
  DESCRIPTOR_DATA *local_1220;
  char local_1218 [4528];
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  char *local_10;
  
  bVar2 = is_affected(in_RDI,(int)gsn_silence);
  if (bVar2) {
    send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
  }
  else {
    uVar1 = in_RDI->comm[0];
    _Var7 = std::pow<int,int>(0,0x526740);
    if (((uVar1 & (long)_Var7) != 0) ||
       ((bVar2 = is_shifted(in_RDI), bVar2 &&
        (bVar2 = is_immortal(in_stack_ffffffffffffed98), !bVar2)))) {
      send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
    }
    else {
      bVar2 = is_affected(in_RDI,(int)gsn_mangled);
      if (bVar2) {
        send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
      }
      else if (*in_RSI == '\0') {
        send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
      }
      else {
        bVar2 = is_affected(in_RDI,(int)gsn_imprisonvoice);
        if (bVar2) {
          send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
        }
        else {
          bVar2 = is_affected(in_RDI,(int)gsn_gag);
          if (bVar2) {
            act(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                in_stack_ffffffffffffed98,0);
            act(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                in_stack_ffffffffffffed98,0);
          }
          else {
            bVar2 = is_affected(in_RDI,(int)gsn_uppercut);
            if (bVar2) {
              send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
            }
            else {
              bVar2 = is_affected(in_RDI,(int)gsn_deafen);
              local_10 = in_RSI;
              if (bVar2) {
                upstring(in_RSI);
                local_10 = palloc_string(in_stack_ffffffffffffedc8);
              }
              check_ooc(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
              bVar3 = str_cmp(in_RDI->name,"Karsus");
              if (((!bVar3) && (pcVar4 = strstr(local_10,"eing"), pcVar4 != (char *)0x0)) &&
                 (pcVar4 = strstr(local_10,"being"), pcVar4 == (char *)0x0)) {
                send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
                send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
                send_to_char(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
              }
              uVar1 = in_RDI->comm[0];
              _Var7 = std::pow<int,int>(0,0x5269d4);
              if ((uVar1 & (long)_Var7) == 0) {
                act(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                    in_stack_ffffffffffffed98,0);
              }
              else {
                pcVar4 = get_char_color(in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0);
                pcVar5 = END_COLOR(in_stack_ffffffffffffeda8);
                sprintf(local_1218,"You yell \'%s$t%s\'",pcVar4,pcVar5);
                act(in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                    in_stack_ffffffffffffed98,0);
              }
              for (local_1220 = descriptor_list; local_1220 != (DESCRIPTOR_DATA *)0x0;
                  local_1220 = local_1220->next) {
                if (((local_1220->connected == 0) && (local_1220->character != in_RDI)) &&
                   ((local_1220->character->in_room != (ROOM_INDEX_DATA *)0x0 &&
                    (local_1220->character->in_room->area == in_RDI->in_room->area)))) {
                  pCVar6 = (CHAR_DATA *)local_1220->character->comm[0];
                  _Var7 = std::pow<int,int>(0,0x526b27);
                  if (((ulong)pCVar6 & (long)_Var7) == 0) {
                    pcVar4 = (char *)local_1220->character->in_room->room_flags[0];
                    _Var7 = std::pow<int,int>(0,0x526b69);
                    if ((((ulong)pcVar4 & (long)_Var7) == 0) &&
                       (bVar3 = is_awake(local_1220->character), bVar3)) {
                      in_stack_ffffffffffffeda0 = local_1218;
                      pCVar6 = (CHAR_DATA *)get_char_color(pCVar6,pcVar4);
                      pcVar4 = END_COLOR(pCVar6);
                      sprintf(in_stack_ffffffffffffeda0,"$n yells \'%s$t%s\'",pCVar6,pcVar4);
                      act_new(in_stack_000012f0,in_stack_000012e8,in_stack_000012e0,
                              in_stack_000012d8,in_stack_000012d4,in_stack_000012d0);
                      bVar3 = is_affected(local_1220->character,(int)gsn_word_of_command);
                      if ((bVar3) &&
                         (pcVar4 = strstr(local_10,local_1220->character->pcdata->command[0]),
                         pcVar4 != (char *)0x0)) {
                        command_execute(in_stack_00000010);
                      }
                    }
                  }
                }
              }
              if (bVar2) {
                free_pstring(in_stack_ffffffffffffeda0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_yell(CHAR_DATA *ch, char *argument)
{
	if (is_affected(ch, gsn_silence))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_NOSHOUT) || (is_shifted(ch) && !is_immortal(ch)))
	{
		send_to_char("You can't yell.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_mangled))
	{
		send_to_char("Your torn throat prevents you from getting the words out.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Yell what?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_imprisonvoice))
	{
		send_to_char("Your vocal cords are frozen solid!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_gag))
	{
		act("You are gagged and cannot speak!", ch, nullptr, nullptr, TO_CHAR);
		act("Muffled sounds emanate from $n's direction as $e attempts in vain to speak through $s gag.", ch, nullptr, nullptr, TO_ROOM);
		return;
	}

	if (is_affected(ch, gsn_uppercut))
	{
		send_to_char("Your jaw hurts too much to move.\n\r", ch);
		return;
	}

	auto deaf = false;
	if (is_affected(ch, gsn_deafen))
	{
		deaf = true;
		argument = palloc_string(upstring(argument));
	}

	check_ooc(ch, argument, "YELL");

	if (!str_cmp(ch->name, "Karsus") && strstr(argument, "eing") && !strstr(argument, "being"))
	{
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
	}

	char buf[MAX_STRING_LENGTH];
	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf, "You yell '%s$t%s'", get_char_color(ch, "yells"), END_COLOR(ch));
		act(buf, ch, argument, nullptr, TO_CHAR);
	}
	else
	{
		act("You yell '$t'", ch, argument, nullptr, TO_CHAR);
	}

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character != ch && d->character->in_room != nullptr && d->character->in_room->area == ch->in_room->area && !IS_SET(d->character->comm, COMM_QUIET))
		{
			if (IS_SET(d->character->in_room->room_flags, ROOM_SILENCE))
				continue;

			/* Can't hear yells while asleep, MORGLUM */
			if (!is_awake(d->character))
				continue;

			sprintf(buf, "$n yells '%s$t%s'", get_char_color(d->character, "yells"), END_COLOR(d->character));
			act_new(buf, ch, argument, d->character, TO_VICT, POS_SLEEPING);

			if (is_affected(d->character, gsn_word_of_command) && strstr(argument, d->character->pcdata->command[0]))
				command_execute(d->character);
		}
	}

	if (deaf)
		free_pstring(argument);
}